

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int propagateConstantExprRewrite(Walker *pWalker,Expr *pExpr)

{
  WhereConst *pConst;
  char cVar1;
  int iVar2;
  
  pConst = (pWalker->u).pConst;
  if ((pConst->bHasAffBlob != 0) && ((pExpr->op - 0x35 < 5 || (pExpr->op == 0x2d)))) {
    propagateConstantExprRewriteOne(pConst,pExpr->pLeft,0);
    if (*pConst->pOomFault != '\0') {
      return 1;
    }
    cVar1 = sqlite3ExprAffinity(pExpr->pLeft);
    if (cVar1 != 'B') {
      propagateConstantExprRewriteOne(pConst,pExpr->pRight,0);
    }
  }
  iVar2 = propagateConstantExprRewriteOne(pConst,pExpr,pConst->bHasAffBlob);
  return iVar2;
}

Assistant:

static int propagateConstantExprRewrite(Walker *pWalker, Expr *pExpr){
  WhereConst *pConst = pWalker->u.pConst;
  assert( TK_GT==TK_EQ+1 );
  assert( TK_LE==TK_EQ+2 );
  assert( TK_LT==TK_EQ+3 );
  assert( TK_GE==TK_EQ+4 );
  if( pConst->bHasAffBlob ){
    if( (pExpr->op>=TK_EQ && pExpr->op<=TK_GE)
     || pExpr->op==TK_IS
    ){
      propagateConstantExprRewriteOne(pConst, pExpr->pLeft, 0);
      if( pConst->pOomFault[0] ) return WRC_Prune;
      if( sqlite3ExprAffinity(pExpr->pLeft)!=SQLITE_AFF_TEXT ){
        propagateConstantExprRewriteOne(pConst, pExpr->pRight, 0);
      }
    }
  }
  return propagateConstantExprRewriteOne(pConst, pExpr, pConst->bHasAffBlob);
}